

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

Block * __thiscall
wasm::I64ToI32Lowering::lowerBitwise
          (I64ToI32Lowering *this,BinaryOp op,Block *result,TempVar *leftLow,TempVar *leftHigh,
          TempVar *rightLow,TempVar *rightHigh)

{
  Builder *this_00;
  Builder *pBVar1;
  Builder *pBVar2;
  Index IVar3;
  Index IVar4;
  LocalGet *pLVar5;
  LocalGet *pLVar6;
  Binary *pBVar7;
  LocalSet *append;
  Block *e;
  
  if (op - AndInt64 < 3) {
    this_00 = (this->builder)._M_t.
              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
              super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar3 = TempVar::operator_cast_to_unsigned_int(rightHigh);
    pBVar1 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar4 = TempVar::operator_cast_to_unsigned_int(leftHigh);
    pLVar5 = Builder::makeLocalGet(pBVar1,IVar4,(Type)0x2);
    pBVar2 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar4 = TempVar::operator_cast_to_unsigned_int(rightHigh);
    pLVar6 = Builder::makeLocalGet(pBVar2,IVar4,(Type)0x2);
    pBVar7 = Builder::makeBinary(pBVar1,op - AddInt64,(Expression *)pLVar5,(Expression *)pLVar6);
    append = Builder::makeLocalSet(this_00,IVar3,(Expression *)pBVar7);
    pBVar1 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar3 = TempVar::operator_cast_to_unsigned_int(leftLow);
    pLVar5 = Builder::makeLocalGet(pBVar1,IVar3,(Type)0x2);
    pBVar2 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar3 = TempVar::operator_cast_to_unsigned_int(rightLow);
    pLVar6 = Builder::makeLocalGet(pBVar2,IVar3,(Type)0x2);
    pBVar7 = Builder::makeBinary(pBVar1,op - AddInt64,(Expression *)pLVar5,(Expression *)pLVar6);
    e = Builder::blockify<wasm::Binary*>(this_00,(Expression *)result,(Expression *)append,pBVar7);
    setOutParam(this,(Expression *)e,rightHigh);
    return e;
  }
  abort();
}

Assistant:

Block* lowerBitwise(BinaryOp op,
                      Block* result,
                      TempVar&& leftLow,
                      TempVar&& leftHigh,
                      TempVar&& rightLow,
                      TempVar&& rightHigh) {
    BinaryOp op32;
    switch (op) {
      case AndInt64:
        op32 = AndInt32;
        break;
      case OrInt64:
        op32 = OrInt32;
        break;
      case XorInt64:
        op32 = XorInt32;
        break;
      default:
        abort();
    }
    result = builder->blockify(
      result,
      builder->makeLocalSet(
        rightHigh,
        builder->makeBinary(op32,
                            builder->makeLocalGet(leftHigh, Type::i32),
                            builder->makeLocalGet(rightHigh, Type::i32))),
      builder->makeBinary(op32,
                          builder->makeLocalGet(leftLow, Type::i32),
                          builder->makeLocalGet(rightLow, Type::i32)));
    setOutParam(result, std::move(rightHigh));
    return result;
  }